

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

bool duckdb::Cast::Operation<int,bool>(int input)

{
  bool bVar1;
  InvalidInputException *this;
  PhysicalType type;
  PhysicalType type_00;
  bool result;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = TryCast::Operation<int,bool>(input,&result,false);
  if (bVar1) {
    return result;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  TypeIdToString_abi_cxx11_(&local_d8,(duckdb *)0x7,type);
  ::std::operator+(&local_b8,"Type ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  ::std::operator+(&local_98,&local_b8," with value ");
  ConvertToString::Operation<int>(&local_f8,input);
  ::std::operator+(&local_78,&local_98,&local_f8);
  ::std::operator+(&local_58,&local_78,
                   " can\'t be cast because the value is out of range for the destination type ");
  TypeIdToString_abi_cxx11_(&local_118,(duckdb *)0x1,type_00);
  ::std::operator+(&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  InvalidInputException::InvalidInputException(this,(string *)&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}